

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
AddCleared(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  int iVar1;
  Rep *pRVar2;
  int iVar3;
  
  pRVar2 = (this->super_RepeatedPtrFieldBase).rep_;
  if (pRVar2 == (Rep *)0x0) {
    iVar3 = (this->super_RepeatedPtrFieldBase).total_size_;
  }
  else {
    iVar3 = pRVar2->allocated_size;
    if (iVar3 != (this->super_RepeatedPtrFieldBase).total_size_) goto LAB_00285d2f;
  }
  iVar1 = (this->super_RepeatedPtrFieldBase).current_size_;
  if (iVar1 <= iVar3) {
    internal::RepeatedPtrFieldBase::InternalExtend
              (&this->super_RepeatedPtrFieldBase,(iVar3 - iVar1) + 1);
    pRVar2 = (this->super_RepeatedPtrFieldBase).rep_;
  }
LAB_00285d2f:
  iVar3 = pRVar2->allocated_size;
  pRVar2->allocated_size = iVar3 + 1;
  pRVar2->elements[iVar3] = value;
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::AddCleared(Element* value) {
  return RepeatedPtrFieldBase::AddCleared<TypeHandler>(value);
}